

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::OrientationError::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,OrientationError *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"OrientationError:\n");
  poVar1 = std::operator<<(poVar1,"\tAzimuth Error:   ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1c0,&this->m_AziErr);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tElevation Error: ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1e0,&this->m_ElvErr);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tRotation Error : ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_200,&this->m_RotErr);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString OrientationError::GetAsString() const
{
    KStringStream ss;

    ss << "OrientationError:\n"
       << "\tAzimuth Error:   " << m_AziErr.GetAsString()
       << "\tElevation Error: " << m_ElvErr.GetAsString()
       << "\tRotation Error : " << m_RotErr.GetAsString();

    return ss.str();
}